

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_has_no_value_exception::option_has_no_value_exception
          (option_has_no_value_exception *this,string *option)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = option->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Option has no value",(allocator<char> *)&local_a0);
  }
  else {
    std::operator+(&local_60,"Option ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::LQUOTE_abi_cxx11_);
    std::operator+(&local_80,&local_60,option);
    std::operator+(&local_a0,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::RQUOTE_abi_cxx11_);
    std::operator+(&local_40,&local_a0," has no value");
  }
  OptionException::OptionException(&this->super_OptionException,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_00130d48;
  return;
}

Assistant:

explicit option_has_no_value_exception(const std::string& option)
    : OptionException(
        !option.empty() ?
        ("Option " + LQUOTE + option + RQUOTE + " has no value") :
        "Option has no value")
    {
    }